

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

Locale * __thiscall
icu_63::RuleBasedCollator::getLocale
          (Locale *__return_storage_ptr__,RuleBasedCollator *this,ULocDataLocaleType type,
          UErrorCode *errorCode)

{
  UBool UVar1;
  Locale *pLVar2;
  Locale *local_50;
  UErrorCode *errorCode_local;
  ULocDataLocaleType type_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (type == ULOC_ACTUAL_LOCALE) {
      if (this->actualLocaleIsSameAsValid == '\0') {
        local_50 = &this->tailoring->actualLocale;
      }
      else {
        local_50 = &this->validLocale;
      }
      Locale::Locale(__return_storage_ptr__,local_50);
    }
    else if (type == ULOC_VALID_LOCALE) {
      Locale::Locale(__return_storage_ptr__,&this->validLocale);
    }
    else {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      pLVar2 = Locale::getRoot();
      Locale::Locale(__return_storage_ptr__,pLVar2);
    }
  }
  else {
    pLVar2 = Locale::getRoot();
    Locale::Locale(__return_storage_ptr__,pLVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Locale
RuleBasedCollator::getLocale(ULocDataLocaleType type, UErrorCode& errorCode) const {
    if(U_FAILURE(errorCode)) {
        return Locale::getRoot();
    }
    switch(type) {
    case ULOC_ACTUAL_LOCALE:
        return actualLocaleIsSameAsValid ? validLocale : tailoring->actualLocale;
    case ULOC_VALID_LOCALE:
        return validLocale;
    case ULOC_REQUESTED_LOCALE:
    default:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return Locale::getRoot();
    }
}